

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O1

cmCommand * __thiscall cmMacroHelperCommand::Clone(cmMacroHelperCommand *this)

{
  pointer pcVar1;
  size_type sVar2;
  _WordT _Var3;
  cmCommand *pcVar4;
  
  pcVar4 = (cmCommand *)operator_new(0xc0);
  (pcVar4->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar4->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar4->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar4->Error)._M_dataplus._M_p = (pointer)&(pcVar4->Error).field_2;
  (pcVar4->Error)._M_string_length = 0;
  (pcVar4->Error).field_2._M_local_buf[0] = '\0';
  pcVar4->Makefile = (cmMakefile *)0x0;
  pcVar4->Enabled = true;
  (pcVar4->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmMacroHelperCommand_006d81d0;
  pcVar4[1].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  pcVar4[1].Makefile = (cmMakefile *)0x0;
  pcVar4[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar4[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&pcVar4[1].Enabled = 0;
  pcVar4[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar4[1].Error._M_string_length = 0;
  pcVar4[1].Error.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pcVar4[1].Error.field_2 + 8) = 0;
  pcVar4[2].super_cmObject._vptr_cmObject = (_func_int **)&pcVar4[2].Helper;
  pcVar4[2].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)
   &pcVar4[2].Helper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(pcVar4 + 1),&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
             &pcVar4[1].Helper.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_finish,&this->Functions);
  std::__cxx11::string::_M_assign((string *)(pcVar4 + 2));
  pcVar1 = (pointer)(this->Policies).Status.super__Base_bitset<4UL>._M_w[0];
  sVar2 = (this->Policies).Status.super__Base_bitset<4UL>._M_w[1];
  _Var3 = (this->Policies).Status.super__Base_bitset<4UL>._M_w[3];
  pcVar4[1].Error.field_2._M_allocated_capacity =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[2];
  *(_WordT *)((long)&pcVar4[1].Error.field_2 + 8) = _Var3;
  pcVar4[1].Error._M_dataplus._M_p = pcVar1;
  pcVar4[1].Error._M_string_length = sVar2;
  return pcVar4;
}

Assistant:

virtual cmCommand* Clone()
  {
    cmMacroHelperCommand *newC = new cmMacroHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->FilePath = this->FilePath;
    newC->Policies = this->Policies;
    return newC;
  }